

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

bool __thiscall
cmMakefile::DeferCall(cmMakefile *this,string *id,string *file,cmListFileFunction *lff)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  DeferCommands *this_00;
  DeferCommand local_68;
  
  this_00 = (this->Defer)._M_t.
            super___uniq_ptr_impl<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>
            ._M_t.
            super__Tuple_impl<0UL,_cmMakefile::DeferCommands_*,_std::default_delete<cmMakefile::DeferCommands>_>
            .super__Head_base<0UL,_cmMakefile::DeferCommands_*,_false>._M_head_impl;
  if (this_00 != (DeferCommands *)0x0) {
    paVar2 = &local_68.Id.field_2;
    local_68.Id._M_dataplus._M_p = (id->_M_dataplus)._M_p;
    paVar1 = &id->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.Id._M_dataplus._M_p == paVar1) {
      local_68.Id.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_68.Id.field_2._8_8_ = *(undefined8 *)((long)&id->field_2 + 8);
      local_68.Id._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_68.Id.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    local_68.Id._M_string_length = id->_M_string_length;
    paVar3 = &local_68.FilePath.field_2;
    (id->_M_dataplus)._M_p = (pointer)paVar1;
    id->_M_string_length = 0;
    (id->field_2)._M_local_buf[0] = '\0';
    local_68.FilePath._M_dataplus._M_p = (file->_M_dataplus)._M_p;
    paVar1 = &file->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.FilePath._M_dataplus._M_p == paVar1) {
      local_68.FilePath.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_68.FilePath.field_2._8_8_ = *(undefined8 *)((long)&file->field_2 + 8);
      local_68.FilePath._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_68.FilePath.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    local_68.FilePath._M_string_length = file->_M_string_length;
    (file->_M_dataplus)._M_p = (pointer)paVar1;
    file->_M_string_length = 0;
    (file->field_2)._M_local_buf[0] = '\0';
    local_68.Command.Impl.
    super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (lff->Impl).
           super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
    local_68.Command.Impl.
    super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (lff->Impl).
         super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    (lff->Impl).
    super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (lff->Impl).
    super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    std::vector<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>::
    emplace_back<cmMakefile::DeferCommand>(&this_00->Commands,&local_68);
    if (local_68.Command.Impl.
        super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.Command.Impl.
                 super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.FilePath._M_dataplus._M_p != paVar3) {
      operator_delete(local_68.FilePath._M_dataplus._M_p,
                      local_68.FilePath.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.Id._M_dataplus._M_p != paVar2) {
      operator_delete(local_68.Id._M_dataplus._M_p,local_68.Id.field_2._M_allocated_capacity + 1);
    }
  }
  return this_00 != (DeferCommands *)0x0;
}

Assistant:

bool cmMakefile::CheckCMP0037(std::string const& targetName,
                              cmStateEnums::TargetType targetType) const
{
  MessageType messageType = MessageType::AUTHOR_WARNING;
  std::ostringstream e;
  bool issueMessage = false;
  switch (this->GetPolicyStatus(cmPolicies::CMP0037)) {
    case cmPolicies::WARN:
      if (targetType != cmStateEnums::INTERFACE_LIBRARY) {
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0037) << "\n";
        issueMessage = true;
      }
      CM_FALLTHROUGH;
    case cmPolicies::OLD:
      break;
    case cmPolicies::NEW:
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
      issueMessage = true;
      messageType = MessageType::FATAL_ERROR;
      break;
  }
  if (issueMessage) {
    e << "The target name \"" << targetName
      << "\" is reserved or not valid for certain "
         "CMake features, such as generator expressions, and may result "
         "in undefined behavior.";
    this->IssueMessage(messageType, e.str());

    if (messageType == MessageType::FATAL_ERROR) {
      return false;
    }
  }
  return true;
}